

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

void amrex::MLLinOp::makeAgglomeratedDMap
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *ba,
               Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *dm)

{
  uint uVar1;
  long *plVar2;
  int *piVar3;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pVVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  allocator_type local_79;
  long local_78;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *local_70;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  Vector<int,_std::allocator<int>_> pmap;
  
  lVar7 = (long)(int)(((long)(ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(ba->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68);
  local_78 = lVar7;
  local_70 = dm;
  local_68 = ba;
  for (lVar8 = 1; pVVar4 = local_68, lVar8 < lVar7; lVar8 = lVar8 + 1) {
    plVar2 = *(long **)&(dm->
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ).
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar8].m_ref.
                        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
    ;
    if (*plVar2 == plVar2[1]) {
      DistributionMapping::makeSFC
                (&local_60,
                 (local_68->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar8,true,*(int *)(DAT_006e0650 + -0x38));
      uVar1 = *(uint *)(DAT_006e0650 + -0x38);
      plVar2 = *(long **)&(pVVar4->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar8].m_ref.
                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&pmap,(plVar2[1] - *plVar2) / 0x1c,&local_79);
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (uVar9 = 0; dm = local_70, uVar9 != uVar1; uVar9 = uVar9 + 1) {
        iVar5 = ParallelContext::local_to_global_rank((int)uVar9);
        piVar3 = local_60.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        for (piVar6 = local_60.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start; piVar6 != piVar3; piVar6 = piVar6 + 1) {
          pmap.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
          ._M_impl.super__Vector_impl_data._M_start[*piVar6] = iVar5;
        }
      }
      DistributionMapping::define
                ((local_70->
                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ).
                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar8,&pmap);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&pmap);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_60);
      lVar7 = local_78;
    }
  }
  return;
}

Assistant:

void
MLLinOp::makeAgglomeratedDMap (const Vector<BoxArray>& ba, Vector<DistributionMapping>& dm)
{
    BL_PROFILE("MLLinOp::makeAgglomeratedDMap");

    BL_ASSERT(!dm[0].empty());
    for (int i = 1, N=ba.size(); i < N; ++i)
    {
        if (dm[i].empty())
        {
            const std::vector< std::vector<int> >& sfc = DistributionMapping::makeSFC(ba[i]);

            const int nprocs = ParallelContext::NProcsSub();
            AMREX_ASSERT(static_cast<int>(sfc.size()) == nprocs);

            Vector<int> pmap(ba[i].size());
            for (int iproc = 0; iproc < nprocs; ++iproc) {
                int grank = ParallelContext::local_to_global_rank(iproc);
                for (int ibox : sfc[iproc]) {
                    pmap[ibox] = grank;
                }
            }
            dm[i].define(std::move(pmap));
        }
    }
}